

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::DescriptorImpl::ToString_abi_cxx11_(DescriptorImpl *this,bool compat_format)

{
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffffb0;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_RSI);
  (**(code **)((in_RSI->_M_dataplus)._M_p + 0x98))(in_RSI,0,local_28,(in_DL & 1) * '\x03');
  anon_unknown.dwarf_1ba5289::AddChecksum(in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(bool compat_format) const final
    {
        std::string ret;
        ToStringHelper(nullptr, ret, compat_format ? StringType::COMPAT : StringType::PUBLIC);
        return AddChecksum(ret);
    }